

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::OneofDescriptorProto::IsInitialized(OneofDescriptorProto *this)

{
  bool bVar1;
  OneofDescriptorProto *this_local;
  
  bVar1 = _internal_has_options(this);
  if ((!bVar1) || (bVar1 = OneofOptions::IsInitialized(this->options_), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OneofDescriptorProto::IsInitialized() const {
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}